

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineSampleLocationsStateCreateInfoEXT *create_info,
          ScratchAllocator *alloc,DynamicStateInfo *dynamic_state_info)

{
  VkPipelineSampleLocationsStateCreateInfoEXT *pVVar1;
  VkSampleLocationEXT *pVVar2;
  byte bVar3;
  
  if ((create_info->sampleLocationsInfo).pNext == (void *)0x0) {
    if (dynamic_state_info == (DynamicStateInfo *)0x0) {
      bVar3 = 0;
    }
    else {
      bVar3 = dynamic_state_info->sample_locations_enable;
    }
    pVVar1 = copy<VkPipelineSampleLocationsStateCreateInfoEXT>(this,create_info,1,alloc);
    if (((dynamic_state_info == (DynamicStateInfo *)0x0) ||
        (dynamic_state_info->sample_locations != false)) ||
       (pVVar1->sampleLocationsEnable == 0 && (bVar3 & 1) == 0)) {
      (pVVar1->sampleLocationsInfo).sType = VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT;
      *(undefined8 *)&(pVVar1->sampleLocationsInfo).field_0x4 = 0;
      *(undefined8 *)((long)&(pVVar1->sampleLocationsInfo).pNext + 4) = 0;
      (pVVar1->sampleLocationsInfo).sampleLocationGridSize.width = 0;
      (pVVar1->sampleLocationsInfo).sampleLocationGridSize.height = 0;
      *(undefined8 *)&(pVVar1->sampleLocationsInfo).sampleLocationsCount = 0;
      *(undefined4 *)((long)&(pVVar1->sampleLocationsInfo).pSampleLocations + 4) = 0;
    }
    else {
      pVVar2 = copy<VkSampleLocationEXT>
                         (this,(pVVar1->sampleLocationsInfo).pSampleLocations,
                          (ulong)(pVVar1->sampleLocationsInfo).sampleLocationsCount,alloc);
      (pVVar1->sampleLocationsInfo).pSampleLocations = pVVar2;
    }
  }
  else {
    pVVar1 = (VkPipelineSampleLocationsStateCreateInfoEXT *)0x0;
  }
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineSampleLocationsStateCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc,
                                             const DynamicStateInfo *dynamic_state_info)
{
	// This is only a thing for VkImageMemoryBarrier pNext.
	if (create_info->sampleLocationsInfo.pNext)
		return nullptr;

	bool dynamic_enable = dynamic_state_info && dynamic_state_info->sample_locations_enable;
	auto *sample_locations = copy(create_info, 1, alloc);
	if (dynamic_state_info && !dynamic_state_info->sample_locations &&
	    (sample_locations->sampleLocationsEnable || dynamic_enable))
	{
		sample_locations->sampleLocationsInfo.pSampleLocations =
				copy(sample_locations->sampleLocationsInfo.pSampleLocations,
				     sample_locations->sampleLocationsInfo.sampleLocationsCount, alloc);
	}
	else
	{
		// Otherwise, ignore the location info.
		// Either it's dynamic, or ignored due to sampleLocationsEnable being VK_FALSE.
		sample_locations->sampleLocationsInfo = { VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT };
	}

	return sample_locations;
}